

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O1

void __thiscall
Comment_SingleLineInsideArray_Test::TestBody(Comment_SingleLineInsideArray_Test *this)

{
  StrictMock<mock_json_callbacks> *this_00;
  FunctionMocker<std::error_code_()> *pFVar1;
  Buffer *pBVar2;
  TypedExpectation<std::error_code_()> *pTVar3;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  _func_int **pp_Var4;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  pointer *__ptr;
  char *in_R9;
  size_type __dnew;
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  MatcherBase<unsigned_long> local_118;
  AssertHelper local_f8;
  undefined1 local_f0 [32];
  internal local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_b8;
  int local_68;
  error_category *local_60;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  this_00 = &(this->super_Comment).callbacks_;
  pFVar1 = &(this->super_Comment).callbacks_.super_mock_json_callbacks.gmock00_begin_array_50;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,this_00);
  local_c0 = (undefined1  [8])pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)local_c0,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                      ,0x77,"callbacks_","begin_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  local_118.vtable_ =
       (VTable *)
       &testing::internal::MatcherBase<unsigned_long>::
        GetVTable<testing::internal::MatcherBase<unsigned_long>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
        ::kVTable;
  local_118.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bdc68;
  mock_json_callbacks::gmock_uint64_value
            ((MockSpec<std::error_code_(unsigned_long)> *)local_c0,
             &this_00->super_mock_json_callbacks,(Matcher<unsigned_long> *)&local_118);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(unsigned_long)> *)local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                       ,0x78,"callbacks_","uint64_value (_)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,2);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_b8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_118);
  pFVar1 = &(this->super_Comment).callbacks_.super_mock_json_callbacks.gmock00_end_array_51;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,this_00);
  local_c0 = (undefined1  [8])pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)local_c0,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                      ,0x79,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c0,
             (this->super_Comment).proxy_.original_,single_line_comments);
  pBVar2 = &local_118.buffer_;
  local_f0._0_8_ = (VTable *)0x39;
  local_118.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)pBVar2;
  pp_Var4 = (_func_int **)std::__cxx11::string::_M_create((ulong *)&local_118,(ulong)local_f0);
  local_118.buffer_.i = local_f0._0_8_;
  builtin_strncpy((char *)((long)pp_Var4 + 0x29),"\n2 // co",8);
  builtin_strncpy((char *)((long)pp_Var4 + 0x31),"mment\n]\n",8);
  pp_Var4[4] = (_func_int *)0x2f20676e696e6961;
  pp_Var4[5] = (_func_int *)0x63202f2f20320a2f;
  pp_Var4[2] = (_func_int *)0x6d6d6f63202f2f20;
  pp_Var4[3] = (_func_int *)0x746e6f6320746e65;
  *pp_Var4 = (_func_int *)0x656d6d6f632f2f5b;
  pp_Var4[1] = (_func_int *)0x2020202c310a746e;
  local_118.vtable_ = (VTable *)local_f0._0_8_;
  *(char *)((long)pp_Var4 + local_f0._0_8_) = '\0';
  local_118.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = pp_Var4;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_f0,local_f0._0_8_);
  local_f0._8_8_ = pp_Var4;
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<callbacks_proxy<mock_json_callbacks>> *)local_c0,
                       (span<const_char,__1L> *)local_f0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  if ((Buffer *)local_118.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface != pBVar2)
  {
    operator_delete(local_118.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface,
                    (ulong)(local_118.buffer_.i + 1));
  }
  local_d0[0] = (internal)(local_68 == 0);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_d0[0]) {
    testing::Message::Message((Message *)&local_120);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_60 + 0x20))(&local_118,local_60,local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_head_impl + 0x10),
               (char *)local_118.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface,
               (long)local_118.vtable_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,local_d0,(AssertionResult *)"p.has_error ()","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
               ,0x83,(char *)local_f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((VTable *)local_f0._0_8_ != (VTable *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((Buffer *)local_118.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        pBVar2) {
      operator_delete(local_118.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface,
                      (ulong)(local_118.buffer_.i + 1));
    }
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b8);
  if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
       )local_c0 != (singleton_storage<callbacks_proxy<mock_json_callbacks>_> *)0x0) {
    operator_delete((void *)local_c0,0x68);
  }
  return;
}

Assistant:

TEST_F (Comment, SingleLineInsideArray) {
    using testing::_;
    EXPECT_CALL (callbacks_, begin_array ()).Times (1);
    EXPECT_CALL (callbacks_, uint64_value (_)).Times (2);
    EXPECT_CALL (callbacks_, end_array ()).Times (1);

    json::parser<decltype (proxy_)> p =
        json::make_parser (proxy_, json::extensions::single_line_comments);
    p.input (R"([//comment
1,    // comment containing //
2 // comment
]
)"s)
        .eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
}